

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDiscardTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ShaderDiscardCase::ShaderDiscardCase
          (ShaderDiscardCase *this,Context *context,char *name,char *description,char *shaderSource,
          ShaderEvalFunc evalFunc,bool usesTexture)

{
  char *pcVar1;
  
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,false,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderDiscardCase_02130c08;
  this->m_usesTexture = usesTexture;
  this->m_brickTexture = (Texture2D *)0x0;
  pcVar1 = (char *)(this->super_ShaderRenderCase).m_fragShaderSource._M_string_length;
  strlen(shaderSource);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderRenderCase).m_fragShaderSource,0,pcVar1,(ulong)shaderSource)
  ;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderRenderCase).m_vertShaderSource,0,
             (char *)(this->super_ShaderRenderCase).m_vertShaderSource._M_string_length,0x1bea004);
  return;
}

Assistant:

ShaderDiscardCase::ShaderDiscardCase (Context& context, const char* name, const char* description, const char* shaderSource, ShaderEvalFunc evalFunc, bool usesTexture)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, false, evalFunc)
	, m_usesTexture		(usesTexture)
	, m_brickTexture	(DE_NULL)
{
	m_fragShaderSource	= shaderSource;
	m_vertShaderSource	=
		"#version 300 es\n"
		"in  highp   vec4 a_position;\n"
		"in  highp   vec4 a_coords;\n"
		"out mediump vec4 v_color;\n"
		"out mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    v_coords = a_coords;\n"
		"}\n";
}